

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

upb_StringView upb_strtable_iter_key(upb_strtable_iter *i)

{
  _Bool _Var1;
  upb_tabent *puVar2;
  upb_StringView uVar3;
  upb_strtable_iter *i_local;
  
  _Var1 = upb_strtable_done(i);
  if (!_Var1) {
    puVar2 = str_tabent(i);
    uVar3 = upb_key_strview(puVar2->key);
    return uVar3;
  }
  __assert_fail("!upb_strtable_done(i)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                ,0x228,"upb_StringView upb_strtable_iter_key(const upb_strtable_iter *)");
}

Assistant:

upb_StringView upb_strtable_iter_key(const upb_strtable_iter* i) {
  UPB_ASSERT(!upb_strtable_done(i));
  return upb_key_strview(str_tabent(i)->key);
}